

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrixFunction.cpp
# Opt level: O2

void getR(int itAtom,double *a,double theta,double (*R) [4])

{
  ulong uVar1;
  int i;
  int j;
  int iVar2;
  long lVar3;
  long lVar4;
  double (*a_00) [4];
  double v [3];
  double transposeT [4] [4];
  double T [4] [4];
  double Q [4] [4];
  double tmp [4] [4];
  
  iVar2 = itAtom * 3 + -3;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    v[lVar3] = a[(itAtom * 3 + -6) + lVar3] - a[iVar2 + lVar3];
  }
  unitization(v);
  a_00 = Q;
  initialize_0(a_00);
  getQ(a_00,v,theta);
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if (lVar3 == 3 || lVar4 == 3) {
        (*a_00)[lVar4] = 0.0;
      }
    }
    a_00 = a_00 + 1;
  }
  Q[3][3] = 1.0;
  initialize_1(T);
  initialize_1(transposeT);
  for (lVar3 = 6; lVar3 != 0x1e; lVar3 = lVar3 + 8) {
    uVar1 = *(ulong *)((long)a + lVar3 + (long)iVar2 * 8 + -6);
    *(ulong *)((long)T[0] + lVar3 * 4) = uVar1;
    *(ulong *)((long)transposeT[0] + lVar3 * 4) = uVar1 ^ 0x8000000000000000;
  }
  matrixProduct(T,Q,tmp);
  matrixProduct(tmp,transposeT,R);
  return;
}

Assistant:

void getR(int itAtom, double * a, double theta, double R[4][4]){
    double v[3];
    int ii=(itAtom-2) *3, jj=(itAtom-1) *3;       // i: the x index of (itAtom-2)
    for (int k=0; k<3; k++)
        v[k] = a[ii+k] - a[jj+k];                             // v = Q(i-1) - Qi
    unitization(v);                                         // v[0]^2 + v[1]^2 + v[2]^2 = 1
    double Q[4][4];
    initialize_0(Q);
    getQ(Q, v, theta);          //set Q[3][3]
    for (int i=0; i<4; i++)
        for (int j=0; j<4; j++)
            if (i==3 || j==3)
                Q[i][j] = 0;
    Q[3][3] = 1;

    double T[4][4], transposeT[4][4];
    initialize_1(T);
    initialize_1(transposeT);
    jj=(itAtom-1) *3;
    for (int p=0; p<3; p++){
        T[p][3] = a[jj+p];
        transposeT[p][3] = -a[jj+p];
    }
    double tmp[4][4];
    matrixProduct(T, Q, tmp);
    matrixProduct(tmp, transposeT, R);
}